

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffdstr(fitsfile *fptr,char *string,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  size_t sVar3;
  int keypos;
  undefined8 uStack_1e0;
  char value [71];
  char valstring [71];
  char comm [73];
  char card [81];
  char nextcomm [73];
  
  if (0 < *status) {
    return *status;
  }
  uStack_1e0 = 0x1cebcb;
  iVar2 = ffgstr(fptr,string,card,status);
  if (iVar2 < 1) {
    pFVar1 = fptr->Fptr;
    keypos = (int)((pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) / 0x50);
    uStack_1e0 = 0x1cec2a;
    ffdrec(fptr,keypos,status);
    uStack_1e0 = 0x1cec47;
    ffpsvc(card,valstring,comm,status);
    iVar2 = *status;
    if (iVar2 < 1) {
      uStack_1e0 = 0x1cec52;
      ffpmrk();
      uStack_1e0 = 0x1cec65;
      ffc2s(valstring,value,status);
      if (*status != 0xcc) {
        do {
          uStack_1e0 = 0x1cec98;
          sVar3 = strlen(value);
          do {
            if (((int)sVar3 == 0) || (value[(long)(int)sVar3 + -1] != '&')) goto LAB_001cebf6;
            uStack_1e0 = 0x1cecbf;
            ffgcnt(fptr,value,nextcomm,status);
            sVar3 = 0;
          } while (value[0] == '\0');
          uStack_1e0 = 0x1cecd5;
          ffdrec(fptr,keypos,status);
        } while( true );
      }
      uStack_1e0 = 0x1cec72;
      ffcmrk();
      *status = 0;
      iVar2 = 0;
    }
  }
  else {
    uStack_1e0 = 0x1cebee;
    snprintf(comm,0x51,"Could not find the %s keyword to delete (ffdkey)",string);
    uStack_1e0 = 0x1cebf6;
    ffpmsg(comm);
LAB_001cebf6:
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffdstr(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *string,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword containing the input string
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char card[FLEN_CARD], message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgstr(fptr, string, card, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                string);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    /* check for string value which may be continued over multiple keywords */
    ffpsvc(card, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}